

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mutexes.c
# Opt level: O1

int run_test_thread_rwlock_trylock(void)

{
  int iVar1;
  undefined8 *extraout_RDX;
  uv_rwlock_t *unaff_RBX;
  int iVar2;
  int64_t eval_b;
  int64_t eval_b_3;
  uv_thread_t thread;
  undefined1 auStack_a8 [16];
  code *pcStack_98;
  long lStack_90;
  long lStack_88;
  undefined1 auStack_80 [16];
  uv_cond_t *puStack_70;
  long lStack_68;
  long lStack_60;
  uv_rwlock_t *puStack_58;
  long local_10;
  
  iVar1 = uv_cond_init(&condvar);
  local_10 = (long)iVar1;
  if (local_10 == 0) {
    iVar1 = uv_mutex_init(&mutex);
    local_10 = (long)iVar1;
    if (local_10 != 0) goto LAB_001ae56f;
    iVar1 = uv_rwlock_init(&rwlock);
    local_10 = (long)iVar1;
    if (local_10 != 0) goto LAB_001ae57e;
    uv_mutex_lock(&mutex);
    iVar1 = uv_thread_create(&local_10,thread_rwlock_trylock_peer,0);
    if (iVar1 != 0) goto LAB_001ae58d;
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != 0) goto LAB_001ae59c;
    synchronize();
    unaff_RBX = &rwlock;
    uv_rwlock_wrunlock(&rwlock);
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 != 0) goto LAB_001ae5ab;
    synchronize();
    unaff_RBX = &rwlock;
    uv_rwlock_rdunlock(&rwlock);
    synchronize();
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_001ae5ba;
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_001ae5c9;
    synchronize();
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 != 0) goto LAB_001ae5d8;
    unaff_RBX = &rwlock;
    uv_rwlock_rdunlock(&rwlock);
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_001ae5e7;
    synchronize();
    iVar1 = uv_thread_join(&local_10);
    if (iVar1 == 0) {
      uv_rwlock_destroy(&rwlock);
      uv_mutex_unlock(&mutex);
      uv_mutex_destroy(&mutex);
      uv_cond_destroy(&condvar);
      return 0;
    }
  }
  else {
    run_test_thread_rwlock_trylock_cold_1();
LAB_001ae56f:
    run_test_thread_rwlock_trylock_cold_2();
LAB_001ae57e:
    run_test_thread_rwlock_trylock_cold_3();
LAB_001ae58d:
    run_test_thread_rwlock_trylock_cold_4();
LAB_001ae59c:
    run_test_thread_rwlock_trylock_cold_5();
LAB_001ae5ab:
    run_test_thread_rwlock_trylock_cold_6();
LAB_001ae5ba:
    run_test_thread_rwlock_trylock_cold_7();
LAB_001ae5c9:
    run_test_thread_rwlock_trylock_cold_8();
LAB_001ae5d8:
    run_test_thread_rwlock_trylock_cold_9();
LAB_001ae5e7:
    run_test_thread_rwlock_trylock_cold_10();
  }
  run_test_thread_rwlock_trylock_cold_11();
  uv_mutex_lock(&mutex);
  iVar1 = uv_rwlock_tryrdlock(&rwlock);
  if (iVar1 == -0x10) {
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_001ae774;
    synchronize();
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 != 0) goto LAB_001ae781;
    unaff_RBX = &rwlock;
    uv_rwlock_rdunlock(&rwlock);
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_001ae78e;
    synchronize();
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != 0) goto LAB_001ae79b;
    synchronize();
    unaff_RBX = &rwlock;
    uv_rwlock_wrunlock(&rwlock);
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 == 0) {
      synchronize();
      uv_rwlock_rdunlock(&rwlock);
      step = step + 1;
      uv_cond_signal(&condvar);
      iVar1 = uv_mutex_unlock(&mutex);
      return iVar1;
    }
  }
  else {
    thread_rwlock_trylock_peer_cold_1();
LAB_001ae774:
    thread_rwlock_trylock_peer_cold_2();
LAB_001ae781:
    thread_rwlock_trylock_peer_cold_3();
LAB_001ae78e:
    thread_rwlock_trylock_peer_cold_4();
LAB_001ae79b:
    thread_rwlock_trylock_peer_cold_5();
  }
  thread_rwlock_trylock_peer_cold_6();
  step = step + 1;
  puStack_70 = (uv_cond_t *)0x1ae7d3;
  puStack_58 = unaff_RBX;
  uv_cond_signal(&condvar);
  iVar1 = step;
  lStack_68 = (long)step;
  do {
    puStack_70 = (uv_cond_t *)0x1ae7ec;
    uv_cond_wait(&condvar,&mutex);
    lStack_60 = (long)step;
  } while (iVar1 == step);
  lStack_68 = lStack_68 + 1;
  if (lStack_60 == lStack_68) {
    return step;
  }
  puStack_70 = (uv_cond_t *)0x1ae826;
  synchronize_cold_1();
  puStack_70 = &condvar;
  iVar2 = (int)&lStack_90;
  pcStack_98 = (code *)0x1ae843;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_80);
  lStack_88 = (long)iVar1;
  lStack_90 = 0;
  if (lStack_88 == 0) {
    pcStack_98 = (code *)0x1ae86d;
    iVar1 = uv_loop_init(&loop);
    lStack_88 = (long)iVar1;
    lStack_90 = 0;
    if (lStack_88 != 0) goto LAB_001aea13;
    pcStack_98 = (code *)0x1ae89e;
    iVar1 = uv_tcp_init(&loop,&tcp_client);
    lStack_88 = (long)iVar1;
    lStack_90 = 0;
    if (lStack_88 != 0) goto LAB_001aea20;
    pcStack_98 = (code *)0x1ae8db;
    iVar1 = uv_tcp_connect(&connect_req,&tcp_client,auStack_80,connect_cb);
    lStack_88 = (long)iVar1;
    lStack_90 = 0;
    if (lStack_88 != 0) goto LAB_001aea2d;
    pcStack_98 = (code *)0x1ae907;
    iVar1 = uv_run(&loop,0);
    lStack_88 = (long)iVar1;
    lStack_90 = 0;
    if (lStack_88 != 0) goto LAB_001aea3a;
    lStack_88 = 1;
    lStack_90 = (long)connect_cb_called;
    if (lStack_90 != 1) goto LAB_001aea47;
    lStack_88 = 1;
    lStack_90 = (long)read_cb_called;
    if (lStack_90 != 1) goto LAB_001aea54;
    lStack_88 = 1;
    lStack_90 = (long)write_cb_called;
    if (lStack_90 != 1) goto LAB_001aea61;
    lStack_88 = 1;
    lStack_90 = (long)close_cb_called;
    if (lStack_90 != 1) goto LAB_001aea6e;
    pcStack_98 = (code *)0x1ae9c9;
    uv_walk(&loop,close_walk_cb,0);
    pcStack_98 = (code *)0x1ae9d3;
    uv_run(&loop,0);
    lStack_88 = 0;
    pcStack_98 = (code *)0x1ae9e4;
    iVar1 = uv_loop_close(&loop);
    lStack_90 = (long)iVar1;
    if (lStack_88 == lStack_90) {
      pcStack_98 = (code *)0x1ae9fe;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_98 = (code *)0x1aea13;
    run_test_not_readable_nor_writable_on_read_error_cold_1();
LAB_001aea13:
    pcStack_98 = (code *)0x1aea20;
    run_test_not_readable_nor_writable_on_read_error_cold_2();
LAB_001aea20:
    pcStack_98 = (code *)0x1aea2d;
    run_test_not_readable_nor_writable_on_read_error_cold_3();
LAB_001aea2d:
    pcStack_98 = (code *)0x1aea3a;
    run_test_not_readable_nor_writable_on_read_error_cold_4();
LAB_001aea3a:
    pcStack_98 = (code *)0x1aea47;
    run_test_not_readable_nor_writable_on_read_error_cold_5();
LAB_001aea47:
    pcStack_98 = (code *)0x1aea54;
    run_test_not_readable_nor_writable_on_read_error_cold_6();
LAB_001aea54:
    pcStack_98 = (code *)0x1aea61;
    run_test_not_readable_nor_writable_on_read_error_cold_7();
LAB_001aea61:
    pcStack_98 = (code *)0x1aea6e;
    run_test_not_readable_nor_writable_on_read_error_cold_8();
LAB_001aea6e:
    pcStack_98 = (code *)0x1aea7b;
    run_test_not_readable_nor_writable_on_read_error_cold_9();
  }
  pcStack_98 = connect_cb;
  run_test_not_readable_nor_writable_on_read_error_cold_10();
  connect_cb_called = connect_cb_called + 1;
  auStack_a8._0_8_ = SEXT48(iVar2);
  if (auStack_a8._0_8_ == 0) {
    iVar1 = uv_read_start(&tcp_client,alloc_cb,read_cb);
    auStack_a8._0_8_ = SEXT48(iVar1);
    if (auStack_a8._0_8_ == 0) {
      auStack_a8 = uv_buf_init(reset_me_cmd,3);
      iVar1 = uv_write(&write_req,&tcp_client,auStack_a8,1,write_cb);
      pcStack_98 = (code *)0x0;
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001aeb67;
    }
  }
  else {
    connect_cb_cold_1();
  }
  connect_cb_cold_2();
LAB_001aeb67:
  connect_cb_cold_3();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 0x40;
  return 0x36e800;
}

Assistant:

TEST_IMPL(thread_rwlock_trylock) {
  uv_thread_t thread;

  ASSERT_OK(uv_cond_init(&condvar));
  ASSERT_OK(uv_mutex_init(&mutex));
  ASSERT_OK(uv_rwlock_init(&rwlock));

  uv_mutex_lock(&mutex);
  ASSERT_OK(uv_thread_create(&thread, thread_rwlock_trylock_peer, NULL));

  /* Hold write lock. */
  ASSERT_OK(uv_rwlock_trywrlock(&rwlock));
  synchronize();  /* Releases the mutex to the other thread. */

  /* Release write lock and acquire read lock.  Pthreads doesn't support
   * the notion of upgrading or downgrading rwlocks, so neither do we.
   */
  uv_rwlock_wrunlock(&rwlock);
  ASSERT_OK(uv_rwlock_tryrdlock(&rwlock));
  synchronize();

  /* Release read lock. */
  uv_rwlock_rdunlock(&rwlock);
  synchronize();

  /* Write lock held by other thread. */
  ASSERT_EQ(UV_EBUSY, uv_rwlock_tryrdlock(&rwlock));
  ASSERT_EQ(UV_EBUSY, uv_rwlock_trywrlock(&rwlock));
  synchronize();

  /* Read lock held by other thread. */
  ASSERT_OK(uv_rwlock_tryrdlock(&rwlock));
  uv_rwlock_rdunlock(&rwlock);
  ASSERT_EQ(UV_EBUSY, uv_rwlock_trywrlock(&rwlock));
  synchronize();

  ASSERT_OK(uv_thread_join(&thread));
  uv_rwlock_destroy(&rwlock);
  uv_mutex_unlock(&mutex);
  uv_mutex_destroy(&mutex);
  uv_cond_destroy(&condvar);

  return 0;
}